

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O3

PAL_ERROR CorUnix::InternalLockFile
                    (CPalThread *pThread,HANDLE hFile,DWORD dwFileOffsetLow,DWORD dwFileOffsetHigh,
                    DWORD nNumberOfBytesToLockLow,DWORD nNumberOfBytesToLockHigh)

{
  long *plVar1;
  PAL_ERROR PVar2;
  long *local_50;
  CFileProcessLocalData *pLocalData;
  IDataLock *pLocalDataLock;
  long *local_38;
  IPalObject *pFileObject;
  
  local_38 = (long *)0x0;
  local_50 = (long *)0x0;
  pLocalData = (CFileProcessLocalData *)0x0;
  if (hFile == (HANDLE)0xffffffffffffffff) {
    PVar2 = 6;
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
  }
  else {
    pLocalDataLock._4_4_ = nNumberOfBytesToLockHigh;
    PVar2 = (**(code **)(*g_pObjectManager + 0x28))
                      (g_pObjectManager,pThread,hFile,aotFile,0x80000000,&local_38);
    if ((PVar2 == 0) &&
       (PVar2 = (**(code **)(*local_38 + 0x18))(local_38,pThread,0,&pLocalData,&local_50),
       PVar2 == 0)) {
      plVar1 = (long *)*local_50;
      if (plVar1 == (long *)0x0) {
        PVar2 = 5;
      }
      else {
        PVar2 = (**(code **)(*plVar1 + 8))
                          (plVar1,pThread,dwFileOffsetLow,dwFileOffsetHigh,nNumberOfBytesToLockLow,
                           pLocalDataLock._4_4_,0,0);
      }
    }
    if (pLocalData != (CFileProcessLocalData *)0x0) {
      (*(code *)pLocalData->pLockController->_vptr_IFileLockController)(pLocalData,pThread,0);
    }
  }
  if (local_38 != (long *)0x0) {
    (**(code **)(*local_38 + 0x40))(local_38,pThread);
  }
  return PVar2;
}

Assistant:

PAL_ERROR
CorUnix::InternalLockFile(
    CPalThread *pThread,
    HANDLE hFile,
    DWORD dwFileOffsetLow,
    DWORD dwFileOffsetHigh,
    DWORD nNumberOfBytesToLockLow,
    DWORD nNumberOfBytesToLockHigh
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pFileObject = NULL;
    CFileProcessLocalData *pLocalData = NULL;
    IDataLock *pLocalDataLock = NULL;

    if (INVALID_HANDLE_VALUE == hFile)
    {
        ERROR( "Invalid file handle\n" );
        palError = ERROR_INVALID_HANDLE;
        goto InternalLockFileExit;
    }

    palError = g_pObjectManager->ReferenceObjectByHandle(
        pThread,
        hFile,
        &aotFile,
        GENERIC_READ,
        &pFileObject
        );

    if (NO_ERROR != palError)
    {
        goto InternalLockFileExit;
    }

    palError = pFileObject->GetProcessLocalData(
        pThread,
        ReadLock, 
        &pLocalDataLock,
        reinterpret_cast<void**>(&pLocalData)
        );

    if (NO_ERROR != palError)
    {
        goto InternalLockFileExit;
    }
    
    if (NULL != pLocalData->pLockController)
    {
        palError = pLocalData->pLockController->CreateFileLock(
            pThread,
            dwFileOffsetLow,
            dwFileOffsetHigh,
            nNumberOfBytesToLockLow,
            nNumberOfBytesToLockHigh,
            IFileLockController::ExclusiveFileLock,
            IFileLockController::FailImmediately
            );
    }
    else
    {
        //
        // This isn't a lockable file (e.g., it may be a pipe)
        //
        
        palError = ERROR_ACCESS_DENIED;
        goto InternalLockFileExit;
    }

InternalLockFileExit:

    if (NULL != pLocalDataLock)
    {
        pLocalDataLock->ReleaseLock(pThread, FALSE);
    }

    if (NULL != pFileObject)
    {
        pFileObject->ReleaseReference(pThread);
    }

    return palError;
}